

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  uint32_t id;
  SPIRFunction *func;
  SPIRType *pSVar13;
  SPIRType *pSVar14;
  ID id_00;
  uint32_t ptr_type_id;
  DummySamplerForCombinedImageHandler handler;
  uint32_t local_1c0 [2];
  string local_1b8;
  undefined **local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined4 local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined1 local_160 [32];
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined1 local_128 [8];
  undefined4 local_120;
  undefined2 local_11c;
  undefined4 local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [32];
  undefined4 local_a0;
  undefined8 local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  OpcodeHandler local_48;
  Compiler *local_40;
  char local_38;
  
  local_48._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_003fa578;
  local_38 = '\0';
  local_40 = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_48);
  id_00.id = 0;
  if (local_38 == '\x01') {
    id = ParsedIR::increase_bound_by(&this->ir,3);
    local_178 = local_160;
    local_198 = &PTR__SPIRType_003f9270;
    local_190 = 0;
    uStack_188 = 0x100000000;
    local_180 = 1;
    local_170 = 0;
    local_168 = 8;
    local_140 = local_128;
    local_138 = 0;
    local_130 = 8;
    local_120 = 0;
    local_11c = 0;
    local_118 = 8;
    local_110 = local_f8;
    local_108 = 0;
    local_100 = 8;
    local_d8 = local_c0;
    local_d0 = 0;
    local_c8 = 8;
    local_a0 = 0;
    local_88 = 0;
    local_80._M_buckets = &local_80._M_single_bucket;
    local_80._M_bucket_count = 1;
    local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_80._M_element_count = 0;
    local_80._M_rehash_policy._M_max_load_factor = 1.0;
    local_80._M_rehash_policy._M_next_resize = 0;
    local_80._M_single_bucket = (__node_base_ptr)0x0;
    local_1c0[0] = id + 1;
    pSVar13 = set<spirv_cross::SPIRType>(this,id);
    *(undefined4 *)&(pSVar13->super_IVariant).field_0xc = 0x12;
    pSVar14 = set<spirv_cross::SPIRType>(this,id + 1);
    (pSVar14->super_IVariant).self.id = (pSVar13->super_IVariant).self.id;
    uVar1 = pSVar13->vecsize;
    uVar2 = pSVar13->columns;
    *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar13->super_IVariant).field_0xc;
    pSVar14->vecsize = uVar1;
    pSVar14->columns = uVar2;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->array,&pSVar13->array);
    SmallVector<bool,_8UL>::operator=(&pSVar14->array_size_literal,&pSVar13->array_size_literal);
    bVar3 = pSVar13->pointer;
    bVar4 = pSVar13->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar13->field_0x7e;
    pSVar14->pointer_depth = pSVar13->pointer_depth;
    pSVar14->pointer = bVar3;
    pSVar14->forward_pointer = bVar4;
    *(undefined2 *)&pSVar14->field_0x7e = uVar5;
    pSVar14->storage = pSVar13->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar14->member_types,&pSVar13->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar14->member_type_index_redirection,&pSVar13->member_type_index_redirection);
    DVar6 = (pSVar13->image).dim;
    bVar3 = (pSVar13->image).depth;
    bVar4 = (pSVar13->image).arrayed;
    bVar7 = (pSVar13->image).ms;
    uVar8 = (pSVar13->image).field_0xb;
    uVar1 = (pSVar13->image).sampled;
    IVar9 = (pSVar13->image).format;
    AVar10 = (pSVar13->image).access;
    TVar11.id = (pSVar13->type_alias).id;
    TVar12.id = (pSVar13->parent_type).id;
    (pSVar14->image).type = (TypeID)(pSVar13->image).type.id;
    (pSVar14->image).dim = DVar6;
    (pSVar14->image).depth = bVar3;
    (pSVar14->image).arrayed = bVar4;
    (pSVar14->image).ms = bVar7;
    (pSVar14->image).field_0xb = uVar8;
    (pSVar14->image).sampled = uVar1;
    (pSVar14->image).format = IVar9;
    (pSVar14->image).access = AVar10;
    pSVar14->type_alias = (TypeID)TVar11.id;
    pSVar14->parent_type = (TypeID)TVar12.id;
    if (pSVar13 != pSVar14) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar14->member_name_cache,&(pSVar13->member_name_cache)._M_h);
    }
    id_00.id = id + 2;
    (pSVar14->super_IVariant).self.id = id;
    pSVar14->storage = StorageClassUniformConstant;
    pSVar14->pointer = true;
    (pSVar14->parent_type).id = id;
    local_1b8._M_dataplus._M_p = (pointer)((ulong)local_1b8._M_dataplus._M_p._4_4_ << 0x20);
    local_1c0[1] = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,id_00.id,local_1c0,(StorageClass *)&local_1b8,(int *)(local_1c0 + 1));
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"SPIRV_Cross_DummySampler","");
    ParsedIR::set_name(&this->ir,id_00,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    this->dummy_sampler_id = id_00.id;
    local_198 = &PTR__SPIRType_003f9270;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_80);
    local_d0 = 0;
    if (local_d8 != local_c0) {
      free(local_d8);
    }
    local_108 = 0;
    if (local_110 != local_f8) {
      free(local_110);
    }
    local_138 = 0;
    if (local_140 != local_128) {
      free(local_140);
    }
    local_170 = 0;
    if (local_178 != local_160) {
      free(local_178);
    }
  }
  return (VariableID)id_00.id;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		SPIRType sampler_type;
		auto &sampler = set<SPIRType>(type_id);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}